

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void __thiscall ExpressionContext::PushScope(ExpressionContext *this,ScopeType type)

{
  uint uniqueId;
  ScopeData *this_00;
  ScopeData *local_20;
  ScopeData *next;
  ExpressionContext *pEStack_10;
  ScopeType type_local;
  ExpressionContext *this_local;
  
  next._4_4_ = type;
  pEStack_10 = this;
  this_00 = get<ScopeData>(this);
  uniqueId = this->uniqueScopeId;
  this->uniqueScopeId = uniqueId + 1;
  ScopeData::ScopeData(this_00,this->allocator,this->scope,uniqueId,next._4_4_);
  local_20 = this_00;
  if (this->scope != (ScopeData *)0x0) {
    SmallArray<ScopeData_*,_2U>::push_back(&this->scope->scopes,&local_20);
    local_20->startOffset = this->scope->dataSize;
  }
  this->scope = local_20;
  if (this->lookupLocation != (SynBase *)0x0) {
    this->scope->unrestricted = true;
  }
  return;
}

Assistant:

void ExpressionContext::PushScope(ScopeType type)
{
	ScopeData *next = new (get<ScopeData>()) ScopeData(allocator, scope, uniqueScopeId++, type);

	if(scope)
	{
		scope->scopes.push_back(next);

		next->startOffset = scope->dataSize;
	}

	scope = next;

	if(lookupLocation)
		scope->unrestricted = true;
}